

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-init.c
# Opt level: O0

_Bool borg_proc_setting(wchar_t setting,char *setting_string,char type,char *line)

{
  char cVar1;
  bool bVar2;
  _Bool _Var3;
  int iVar4;
  size_t sVar5;
  ushort **ppuVar6;
  char ch;
  char *pcStack_28;
  _Bool negative;
  char *line_local;
  char type_local;
  char *setting_string_local;
  wchar_t setting_local;
  
  bVar2 = false;
  for (pcStack_28 = line; *pcStack_28 == ' '; pcStack_28 = pcStack_28 + 1) {
  }
  _Var3 = prefix_i(pcStack_28,setting_string);
  if (_Var3) {
    sVar5 = strlen(setting_string);
    pcStack_28 = pcStack_28 + sVar5;
    do {
      while( true ) {
        do {
          while( true ) {
            if (*pcStack_28 == '\0') goto LAB_002acd44;
            cVar1 = *pcStack_28;
            if ((cVar1 != ' ') && (cVar1 != '=')) break;
            pcStack_28 = pcStack_28 + 1;
          }
          if (type == 'b') {
            if ((((cVar1 == 'T') || (cVar1 == 't')) || (cVar1 == '1')) ||
               ((cVar1 == 'Y' || (cVar1 == 'y')))) {
              borg_cfg[setting] = 1;
            }
            else {
              borg_cfg[setting] = 0;
            }
            goto LAB_002acd44;
          }
        } while (type != 'i');
        if (cVar1 != '-') break;
        bVar2 = true;
        pcStack_28 = pcStack_28 + 1;
      }
      ppuVar6 = __ctype_b_loc();
    } while (((*ppuVar6)[(int)cVar1] & 0x800) == 0);
    iVar4 = atoi(pcStack_28);
    borg_cfg[setting] = iVar4;
LAB_002acd44:
    if (bVar2) {
      borg_cfg[setting] = -borg_cfg[setting];
    }
    setting_string_local._7_1_ = true;
  }
  else {
    setting_string_local._7_1_ = false;
  }
  return setting_string_local._7_1_;
}

Assistant:

static bool borg_proc_setting(
    int setting, const char *setting_string, char type, const char *line)
{
    bool negative = false;

    /* skip leading space */
    while (*line == ' ')
        line++;
    if (!prefix_i(line, setting_string))
        return false;

    line += strlen(setting_string);

    /* accept either */
    /* value true or */
    /* value=true or */
    /* value=1 or */
    /* value y */
    while (*line) {
        char ch = *line;
        if (ch == ' ' || ch == '=') {
            line++;
            continue;
        }

        if (type == 'b') {
            if (ch == 'T' || ch == 't' || ch == '1' || ch == 'Y' || ch == 'y')
                borg_cfg[setting] = true;
            else
                borg_cfg[setting] = false;

            break;
        }
        if (type == 'i') {
            if (ch == '-') {
                negative = true;
                line++;
                continue;
            }
            if (isdigit(ch)) {
                borg_cfg[setting] = atoi(line);
                break;
            }
        }
    }

    if (negative)
        borg_cfg[setting] *= -1;

    return true;
}